

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O0

bool __thiscall
despot::Adventurer::Step
          (Adventurer *this,State *s,double random_num,ACT_TYPE action,double *reward,OBS_TYPE *obs)

{
  bool bVar1;
  int iVar2;
  const_reference pvVar3;
  const_reference this_00;
  const_reference this_01;
  size_type sVar4;
  const_reference pvVar5;
  int index;
  State *next;
  double dStack_68;
  int i;
  double sum;
  vector<despot::State,_std::allocator<despot::State>_> *distribution;
  bool terminal;
  int goal_type;
  int position;
  AdventurerState *state;
  OBS_TYPE *obs_local;
  double *reward_local;
  double dStack_28;
  ACT_TYPE action_local;
  double random_num_local;
  State *s_local;
  Adventurer *this_local;
  
  *reward = 0.0;
  iVar2 = *(int *)(s + 0xc) / this->size_;
  if ((*(int *)(s + 0xc) % this->size_ == this->size_ + -1) && (action == 0)) {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->goal_reward_,(long)iVar2);
    *reward = *pvVar3;
    this_local._7_1_ = true;
  }
  else {
    bVar1 = true;
    this_00 = std::
              vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
              ::operator[](&this->transition_probabilities_,(long)*(int *)(s + 0xc));
    this_01 = std::
              vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
              ::operator[](this_00,(long)action);
    dStack_68 = 0.0;
    next._4_4_ = 0;
    while( true ) {
      sVar4 = std::vector<despot::State,_std::allocator<despot::State>_>::size(this_01);
      dStack_28 = random_num;
      if (sVar4 <= (ulong)(long)next._4_4_) break;
      pvVar5 = std::vector<despot::State,_std::allocator<despot::State>_>::operator[]
                         (this_01,(long)next._4_4_);
      dStack_68 = *(double *)(pvVar5 + 0x18) + dStack_68;
      if (random_num <= dStack_68) {
        bVar1 = false;
        *(undefined4 *)(s + 0xc) = *(undefined4 *)(pvVar5 + 0xc);
        dStack_28 = (dStack_68 - random_num) / *(double *)(pvVar5 + 0x18);
        break;
      }
      next._4_4_ = next._4_4_ + 1;
    }
    if (bVar1) {
      *reward = -10.0;
      this_local._7_1_ = true;
    }
    else {
      if (dStack_28 < this->obs_noise_) {
        *obs = (long)(((int)(dStack_28 / (this->obs_noise_ / (double)(this->num_goals_ + -1))) + 1 +
                      iVar2) % this->num_goals_);
      }
      else {
        *obs = (long)iVar2;
      }
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Adventurer::Step(State& s, double random_num, ACT_TYPE action, double& reward,
	OBS_TYPE& obs) const {
	AdventurerState& state = static_cast<AdventurerState&>(s);

	reward = 0.0;
	int position = state.state_id % size_;
	int goal_type = state.state_id / size_;

	if (position == size_ - 1 && action == A_STAY) {
		reward = goal_reward_[goal_type];
		return true;
	}

	bool terminal = true;
	const vector<State>& distribution =
		transition_probabilities_[state.state_id][action];
	double sum = 0;
	for (int i = 0; i < distribution.size(); i++) {
		const State& next = distribution[i];
		sum += next.weight;
		if (sum >= random_num) {
			terminal = false;
			state.state_id = next.state_id;

			random_num = (sum - random_num) / next.weight;
			break;
		}
	}

	if (terminal) {
		reward = -10;
		return true;
	}

	if (random_num >= obs_noise_) {
		obs = goal_type;
	} else {
		int index = int(random_num / (obs_noise_ / (num_goals_ - 1)));
		obs = (1 + index + goal_type) % num_goals_;
	}

	return false;
}